

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

ActionMessage * __thiscall
helics::NetworkCommsInterface::generateReplyToIncomingMessage
          (ActionMessage *__return_storage_ptr__,NetworkCommsInterface *this,ActionMessage *cmd)

{
  undefined2 uVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  ushort uVar5;
  string_view host;
  string_view host_00;
  allocator<char> local_59;
  char *local_58;
  size_t local_50;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  bVar3 = isProtocolCommand(cmd);
  if (bVar3) {
    iVar4 = cmd->messageID;
    if (iVar4 == 0x12d) {
      ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
      __return_storage_ptr__->messageID = 0x130;
      return __return_storage_ptr__;
    }
    if (iVar4 == 0x5af) {
      uVar1 = cmd->counter;
      uVar5 = 2;
      if (uVar1 != 0) {
        uVar5 = uVar1;
      }
      sVar2 = (cmd->payload).bufferSize;
      if (sVar2 == 0) {
        host_00._M_str = "localhost";
        host_00._M_len = 9;
        iVar4 = findOpenPort(this,(uint)uVar5,host_00);
      }
      else {
        local_38._M_str = (char *)(cmd->payload).heap;
        local_38._M_len = sVar2;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_58,&local_38,&local_59);
        host._M_str = local_58;
        host._M_len = local_50;
        iVar4 = findOpenPort(this,(uint)uVar5,host);
        std::__cxx11::string::~string((string *)&local_58);
      }
      ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
      __return_storage_ptr__->messageID = 0x5ab;
      (__return_storage_ptr__->source_id).gid = (this->PortNumber).super___atomic_base<int>._M_i;
      (__return_storage_ptr__->dest_handle).hid = iVar4;
      __return_storage_ptr__->counter = cmd->counter;
      return __return_storage_ptr__;
    }
    if (iVar4 == 0x5ad) {
      ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
      __return_storage_ptr__->messageID = 0x5ab;
      (__return_storage_ptr__->dest_handle).hid = (this->PortNumber).super___atomic_base<int>._M_i;
      return __return_storage_ptr__;
    }
  }
  ActionMessage::ActionMessage(__return_storage_ptr__,cmd_ignore);
  return __return_storage_ptr__;
}

Assistant:

ActionMessage NetworkCommsInterface::generateReplyToIncomingMessage(ActionMessage& cmd)
{
    if (isProtocolCommand(cmd)) {
        switch (cmd.messageID) {
            case QUERY_PORTS: {
                ActionMessage portReply(CMD_PROTOCOL);
                portReply.messageID = PORT_DEFINITIONS;
                portReply.setExtraData(PortNumber);
                return portReply;
            } break;
            case REQUEST_PORTS: {
                int cnt = (cmd.counter == 0) ? 2 : cmd.counter;
                auto openPort = (cmd.name().empty()) ? findOpenPort(cnt, localHostString) :
                                                       findOpenPort(cnt, std::string(cmd.name()));
                ActionMessage portReply(CMD_PROTOCOL);
                portReply.messageID = PORT_DEFINITIONS;
                portReply.source_id = GlobalFederateId(PortNumber);
                portReply.setExtraData(openPort);
                portReply.counter = cmd.counter;
                return portReply;
            } break;
            case CONNECTION_REQUEST: {
                ActionMessage connAck(CMD_PROTOCOL);
                connAck.messageID = CONNECTION_ACK;
                return connAck;
            } break;
            default:
                break;
        }
    }
    ActionMessage resp(CMD_IGNORE);
    return resp;
}